

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffshft(fitsfile *fptr,LONGLONG firstbyte,LONGLONG nbytes,LONGLONG nshift,int *status)

{
  int iVar1;
  long in_RCX;
  int *in_RDX;
  long in_RDI;
  int *in_R8;
  char buffer [100000];
  LONGLONG ntodo;
  LONGLONG ptr;
  long ntomov;
  long lStack_186f8;
  int *in_stack_fffffffffffe7910;
  int *status_00;
  undefined1 auStack_186e8 [4];
  int in_stack_fffffffffffe791c;
  LONGLONG in_stack_fffffffffffe7920;
  fitsfile *in_stack_fffffffffffe7928;
  int *in_stack_fffffffffffe7950;
  void *in_stack_fffffffffffe7958;
  int *in_stack_fffffffffffe7960;
  fitsfile *in_stack_fffffffffffe7968;
  LONGLONG in_stack_fffffffffffe7970;
  fitsfile *in_stack_fffffffffffe7978;
  int *local_48;
  int local_4;
  
  local_48 = in_RDX;
  if (*in_R8 < 1) {
    for (; local_48 != (int *)0x0; local_48 = (int *)((long)local_48 - (long)status_00)) {
      status_00 = local_48;
      if (99999 < (long)local_48) {
        status_00 = (int *)0x186a0;
      }
      in_stack_fffffffffffe7910 = status_00;
      ffmbyt(in_stack_fffffffffffe7928,in_stack_fffffffffffe7920,in_stack_fffffffffffe791c,status_00
            );
      ffgbyt(in_stack_fffffffffffe7968,(LONGLONG)in_stack_fffffffffffe7960,in_stack_fffffffffffe7958
             ,in_stack_fffffffffffe7950);
      ffmbyt(in_stack_fffffffffffe7928,in_stack_fffffffffffe7920,in_stack_fffffffffffe791c,
             in_stack_fffffffffffe7910);
      iVar1 = ffpbyt(in_stack_fffffffffffe7978,in_stack_fffffffffffe7970,in_stack_fffffffffffe7968,
                     in_stack_fffffffffffe7960);
      if (0 < iVar1) {
        ffpmsg((char *)0x11d252);
        return *in_R8;
      }
    }
    if (*(int *)(*(long *)(in_RDI + 8) + 0x58) == 1) {
      memset(auStack_186e8,0x20,100000);
    }
    else {
      memset(auStack_186e8,0,100000);
    }
    local_48 = (int *)in_RCX;
    if (in_RCX < 0) {
      local_48 = (int *)-in_RCX;
    }
    ffmbyt(in_stack_fffffffffffe7928,in_stack_fffffffffffe7920,in_stack_fffffffffffe791c,
           in_stack_fffffffffffe7910);
    for (; local_48 != (int *)0x0; local_48 = (int *)((long)local_48 - lStack_186f8)) {
      if ((long)local_48 < 100000) {
        lStack_186f8 = (long)local_48;
      }
      else {
        lStack_186f8 = 100000;
      }
      ffpbyt(in_stack_fffffffffffe7978,in_stack_fffffffffffe7970,in_stack_fffffffffffe7968,
             in_stack_fffffffffffe7960);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffshft(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstbyte, /* I - position of first byte in block to shift */
           LONGLONG nbytes,    /* I - size of block of bytes to shift          */
           LONGLONG nshift,    /* I - size of shift in bytes (+ or -)          */
           int *status)     /* IO - error status                            */
/*
    Shift block of bytes by nshift bytes (positive or negative).
    A positive nshift value moves the block down further in the file, while a
    negative value shifts the block towards the beginning of the file.
*/
{
#define shftbuffsize 100000
    long ntomov;
    LONGLONG ptr, ntodo;
    char buffer[shftbuffsize];

    if (*status > 0)
        return(*status);

    ntodo = nbytes;   /* total number of bytes to shift */

    if (nshift > 0)
            /* start at the end of the block and work backwards */
            ptr = firstbyte + nbytes;
    else
            /* start at the beginning of the block working forwards */
            ptr = firstbyte;

    while (ntodo)
    {
        /* number of bytes to move at one time */
        ntomov = (long) (minvalue(ntodo, shftbuffsize));

        if (nshift > 0)     /* if moving block down ... */
            ptr -= ntomov;

        /* move to position and read the bytes to be moved */

        ffmbyt(fptr, ptr, REPORT_EOF, status);
        ffgbyt(fptr, ntomov, buffer, status);

        /* move by shift amount and write the bytes */
        ffmbyt(fptr, ptr + nshift, IGNORE_EOF, status);
        if (ffpbyt(fptr, ntomov, buffer, status) > 0)
        {
           ffpmsg("Error while shifting block (ffshft)");
           return(*status);
        }

        ntodo -= ntomov;
        if (nshift < 0)     /* if moving block up ... */
            ptr += ntomov;
    }

    /* now overwrite the old data with fill */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
       memset(buffer, 32, shftbuffsize); /* fill ASCII tables with spaces */
    else
       memset(buffer,  0, shftbuffsize); /* fill other HDUs with zeros */


    if (nshift < 0)
    {
        ntodo = -nshift;
        /* point to the end of the shifted block */
        ptr = firstbyte + nbytes + nshift;
    }
    else
    {
        ntodo = nshift;
        /* point to original beginning of the block */
        ptr = firstbyte;
    }

    ffmbyt(fptr, ptr, REPORT_EOF, status);

    while (ntodo)
    {
        ntomov = (long) (minvalue(ntodo, shftbuffsize));
        ffpbyt(fptr, ntomov, buffer, status);
        ntodo -= ntomov;
    }
    return(*status);
}